

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

Am_Object in_target(Am_Object *top_level,Am_Object *in_leaf,Am_Object *event_window,int x,int y)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  float in_R9D;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object new_leaf;
  undefined1 local_78 [8];
  Am_Value_List parts;
  Am_Object local_60;
  Am_Object leaf;
  Am_Object owner;
  undefined1 local_40 [8];
  Am_Value target_value;
  int y_local;
  int x_local;
  Am_Object *event_window_local;
  Am_Object *in_leaf_local;
  Am_Object *top_level_local;
  
  target_value.value.float_value = in_R9D;
  target_value.value.long_value._4_4_ = y;
  pAVar2 = Am_Object::Peek(event_window,0x1a1,0);
  Am_Value::Am_Value((Am_Value *)local_40,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_40);
  if (bVar1) {
    Am_Object::Am_Object(top_level,event_window);
  }
  else {
    bVar1 = Am_Object::operator==(event_window,in_leaf);
    if (bVar1) {
      Am_Object::Am_Object(top_level,&Am_No_Object);
    }
    else {
      Am_Object::Get_Owner(&leaf,(Am_Slot_Flags)event_window);
      Am_Object::Am_Object(&local_60,event_window);
      do {
        Am_Object::Am_Object((Am_Object *)&parts.item,in_leaf);
        bVar1 = Am_Object::Is_Part_Of(&leaf,(Am_Object *)&parts.item);
        Am_Object::~Am_Object((Am_Object *)&parts.item);
        if (!bVar1) {
          Am_Object::Am_Object(top_level,&Am_No_Object);
          break;
        }
        pAVar2 = Am_Object::Get(&leaf,0x82,0);
        Am_Value_List::Am_Value_List((Am_Value_List *)local_78,pAVar2);
        Am_Value_List::Start((Am_Value_List *)local_78);
        value = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
        Am_Value_List::Member((Am_Value_List *)local_78,value);
        Am_Value_List::Prev((Am_Value_List *)local_78);
        while (bVar1 = Am_Value_List::First((Am_Value_List *)local_78), ((bVar1 ^ 0xffU) & 1) != 0)
        {
          pAVar2 = Am_Value_List::Get((Am_Value_List *)local_78);
          Am_Object::operator=(&local_60,pAVar2);
          Am_Point_In_Obj(&new_leaf,(int)&local_60,target_value.value.long_value._4_4_,
                          (Am_Object *)(ulong)(uint)target_value.value.float_value);
          bVar1 = Am_Object::Valid(&new_leaf);
          Am_Object::~Am_Object(&new_leaf);
          if (bVar1) {
            Am_Point_In_Leaf(&local_88,(int)&local_60,target_value.value.long_value._4_4_,
                             (Am_Object *)(ulong)(uint)target_value.value.float_value,SUB41(x,0),
                             true);
            bVar1 = Am_Object::Valid(&local_88);
            if (bVar1) {
              in_target(&local_90,&local_60,&local_88,x,target_value.value.long_value._4_4_);
              Am_Object::operator=(&local_60,&local_90);
              Am_Object::~Am_Object(&local_90);
              bVar1 = Am_Object::Valid(&local_60);
              if (!bVar1) goto LAB_00348772;
              Am_Object::Am_Object(top_level,&local_60);
              bVar1 = true;
            }
            else {
LAB_00348772:
              bVar1 = false;
            }
            Am_Object::~Am_Object(&local_88);
            if (bVar1) goto LAB_0034885e;
          }
          Am_Value_List::Prev((Am_Value_List *)local_78);
        }
        Am_Object::operator=(&local_60,&leaf);
        pAVar2 = Am_Object::Peek(&local_60,0x1a1,0);
        Am_Value::operator=((Am_Value *)local_40,pAVar2);
        bVar1 = Am_Value::Valid((Am_Value *)local_40);
        if (bVar1) {
          Am_Object::Am_Object(top_level,&local_60);
          bVar1 = true;
        }
        else {
          Am_Object::Get_Owner(&local_98,(Am_Slot_Flags)&local_60);
          Am_Object::operator=(&leaf,&local_98);
          Am_Object::~Am_Object(&local_98);
          bVar1 = false;
        }
LAB_0034885e:
        Am_Value_List::~Am_Value_List((Am_Value_List *)local_78);
      } while (!bVar1);
      Am_Object::~Am_Object(&local_60);
      Am_Object::~Am_Object(&leaf);
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_40);
  return (Am_Object)(Am_Object_Data *)top_level;
}

Assistant:

static Am_Object
in_target(Am_Object &top_level, Am_Object &in_leaf, Am_Object &event_window,
          int x, int y)
{
  Am_Value target_value = in_leaf.Peek(Am_DROP_TARGET);
  if (target_value.Valid())
    return in_leaf;
  if (in_leaf == top_level)
    return Am_No_Object;
  Am_Object owner = in_leaf.Get_Owner();
  Am_Object leaf = in_leaf;
  while (owner.Is_Part_Of(top_level)) {
    Am_Value_List parts = owner.Get(Am_GRAPHICAL_PARTS);
    parts.Start();
    parts.Member(leaf);
    parts.Prev();
    while (!parts.First()) {
      leaf = parts.Get();
      if (Am_Point_In_Obj(leaf, x, y, event_window).Valid()) {
        Am_Object new_leaf = Am_Point_In_Leaf(leaf, x, y, event_window);
        if (new_leaf.Valid()) {
          leaf = in_target(leaf, new_leaf, event_window, x, y);
          if (leaf.Valid())
            return leaf;
        }
      }
      parts.Prev();
    }
    leaf = owner;
    target_value = leaf.Peek(Am_DROP_TARGET);
    if (target_value.Valid())
      return leaf;
    owner = leaf.Get_Owner();
  }
  return Am_No_Object;
}